

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O1

double icu_63::GregorianCalendar::computeJulianDayOfYear
                 (UBool isGregorian,int32_t year,UBool *isLeap)

{
  int32_t iVar1;
  uint uVar2;
  int64_t iVar3;
  int64_t iVar4;
  bool bVar5;
  double dVar6;
  
  *isLeap = (year & 3U) == 0;
  iVar1 = ClockMath::floorDivide(year + -1,4);
  dVar6 = (double)(year + -1) * 365.0 + (double)iVar1 + 1721423.0;
  if (isGregorian != '\0') {
    if (*isLeap == '\0') {
      bVar5 = false;
    }
    else {
      uVar2 = year * -0x3d70a3d7 + 0x51eb850;
      bVar5 = true;
      if ((uVar2 >> 2 | year * 0x40000000) < 0x28f5c29) {
        bVar5 = (uVar2 >> 4 | year * -0x70000000) < 0xa3d70b;
      }
    }
    *isLeap = bVar5;
    iVar3 = ClockMath::floorDivide((long)year + -1,400);
    iVar4 = ClockMath::floorDivide((long)year + -1,100);
    dVar6 = dVar6 + (double)(((int)iVar3 - (int)iVar4) + 2);
  }
  return dVar6;
}

Assistant:

double GregorianCalendar::computeJulianDayOfYear(UBool isGregorian,
                                                 int32_t year, UBool& isLeap)
{
    isLeap = year%4 == 0;
    int32_t y = year - 1;
    double julianDay = 365.0*y + ClockMath::floorDivide(y, 4) + (kJan1_1JulianDay - 3);

    if (isGregorian) {
        isLeap = isLeap && ((year%100 != 0) || (year%400 == 0));
        // Add 2 because Gregorian calendar starts 2 days after Julian calendar
        julianDay += Grego::gregorianShift(year);
    }

    return julianDay;
}